

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::ClipperBase::Reset(ClipperBase *this)

{
  LocalMinima *pLVar1;
  TEdge *pTVar2;
  
  pLVar1 = this->m_MinimaList;
  this->m_CurrentLM = pLVar1;
  for (; pLVar1 != (LocalMinima *)0x0; pLVar1 = pLVar1->next) {
    for (pTVar2 = pLVar1->leftBound; pTVar2 != (TEdge *)0x0; pTVar2 = pTVar2->nextInLML) {
      pTVar2->xcurr = pTVar2->xbot;
      pTVar2->ycurr = pTVar2->ybot;
      pTVar2->side = esLeft;
      pTVar2->outIdx = -1;
    }
    for (pTVar2 = pLVar1->rightBound; pTVar2 != (TEdge *)0x0; pTVar2 = pTVar2->nextInLML) {
      pTVar2->xcurr = pTVar2->xbot;
      pTVar2->ycurr = pTVar2->ybot;
      pTVar2->side = esRight;
      pTVar2->outIdx = -1;
    }
  }
  return;
}

Assistant:

void ClipperBase::Reset()
{
  m_CurrentLM = m_MinimaList;
  if( !m_CurrentLM ) return; //ie nothing to process

  //reset all edges ...
  LocalMinima* lm = m_MinimaList;
  while( lm )
  {
    TEdge* e = lm->leftBound;
    while( e )
    {
      e->xcurr = e->xbot;
      e->ycurr = e->ybot;
      e->side = esLeft;
      e->outIdx = -1;
      e = e->nextInLML;
    }
    e = lm->rightBound;
    while( e )
    {
      e->xcurr = e->xbot;
      e->ycurr = e->ybot;
      e->side = esRight;
      e->outIdx = -1;
      e = e->nextInLML;
    }
    lm = lm->next;
  }
}